

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scolumn_dfs.c
# Opt level: O1

int ilu_scolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
                   int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int_t *piVar5;
  int_t iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  int next;
  int jcol_00;
  ulong uVar11;
  int_t *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int_t local_90;
  int local_8c;
  int_t *local_88;
  int local_7c;
  long local_78;
  long local_70;
  long local_68;
  int *local_60;
  int local_58;
  int local_54;
  ulong local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  uVar11 = (ulong)(uint)jcol;
  piVar3 = Glu->xsup;
  piVar4 = Glu->supno;
  local_88 = Glu->lsub;
  piVar5 = Glu->xlsub;
  local_90 = Glu->nzlmax;
  local_60 = perm_r;
  local_40 = nseg;
  local_38 = segrep;
  local_58 = sp_ienv(7);
  iVar15 = jcol + -1;
  local_70 = (long)jcol;
  iVar14 = piVar4[local_70];
  next = piVar5[local_70];
  iVar7 = *lsub_col;
  piVar12 = local_88;
  local_8c = iVar14;
  if (iVar7 != -1) {
    local_68 = 0;
    piVar16 = local_60;
    local_7c = iVar15;
    local_50 = uVar11;
    local_48 = lsub_col;
    do {
      local_48[local_68] = -1;
      iVar13 = marker[(long)(m * 2) + (long)iVar7];
      iVar10 = (int)uVar11;
      if (iVar13 != iVar10) {
        marker[(long)(m * 2) + (long)iVar7] = iVar10;
        iVar1 = piVar16[iVar7];
        if ((long)iVar1 == -1) {
          lVar9 = (long)next;
          next = next + 1;
          piVar12[lVar9] = iVar7;
          if (local_90 <= next) {
            iVar6 = sLUMemXpand(iVar10,next,LSUB,&local_90,Glu);
            if (iVar6 != 0) {
              return iVar6;
            }
            piVar12 = Glu->lsub;
            uVar11 = local_50;
            piVar16 = local_60;
            iVar15 = local_7c;
          }
          if (iVar13 != iVar15) {
            iVar14 = -1;
          }
        }
        else {
          iVar7 = piVar3[(long)piVar4[iVar1] + 1];
          lVar9 = (long)iVar7;
          if (repfnz[lVar9 + -1] == -1) {
            parent[lVar9 + -1] = -1;
            repfnz[lVar9 + -1] = iVar1;
            piVar8 = piVar5 + piVar3[piVar4[lVar9 + -1]];
            local_78 = lVar9 + -1;
            iVar13 = iVar14;
            while( true ) {
              iVar10 = *piVar8;
              local_88 = (int_t *)CONCAT44(local_88._4_4_,piVar5[iVar7]);
              if (iVar10 < piVar5[iVar7]) {
                do {
                  iVar7 = piVar12[iVar10];
                  iVar10 = iVar10 + 1;
                  iVar1 = marker[(long)(m * 2) + (long)iVar7];
                  jcol_00 = (int)uVar11;
                  if (iVar1 != jcol_00) {
                    marker[(long)(m * 2) + (long)iVar7] = jcol_00;
                    iVar2 = piVar16[iVar7];
                    if ((long)iVar2 == -1) {
                      lVar9 = (long)next;
                      next = next + 1;
                      piVar12[lVar9] = iVar7;
                      if (local_90 <= next) {
                        local_54 = iVar14;
                        iVar6 = sLUMemXpand(jcol_00,next,LSUB,&local_90,Glu);
                        if (iVar6 != 0) {
                          return iVar6;
                        }
                        piVar12 = Glu->lsub;
                        uVar11 = local_50;
                        piVar16 = local_60;
                        iVar15 = local_7c;
                        iVar13 = local_54;
                      }
                      iVar14 = iVar13;
                      iVar13 = iVar14;
                      if (iVar1 != iVar15) {
                        iVar14 = -1;
                        iVar13 = iVar14;
                      }
                    }
                    else {
                      lVar9 = (long)piVar3[(long)piVar4[iVar2] + 1];
                      if (repfnz[lVar9 + -1] == -1) {
                        xplore[(int)local_78] = iVar10;
                        parent[lVar9 + -1] = (int)local_78;
                        repfnz[lVar9 + -1] = iVar2;
                        iVar10 = piVar5[piVar3[piVar4[lVar9 + -1]]];
                        local_88 = (int_t *)CONCAT44(local_88._4_4_,piVar5[lVar9]);
                        local_78 = lVar9 + -1;
                      }
                      else if (iVar2 < repfnz[lVar9 + -1]) {
                        repfnz[lVar9 + -1] = iVar2;
                      }
                    }
                  }
                } while (iVar10 < (int)local_88);
              }
              local_38[*local_40] = (int)local_78;
              *local_40 = *local_40 + 1;
              lVar9 = (long)parent[(int)local_78];
              if (lVar9 == -1) break;
              piVar8 = xplore + lVar9;
              iVar7 = parent[(int)local_78] + 1;
              local_78 = lVar9;
            }
          }
          else if (iVar1 < repfnz[lVar9 + -1]) {
            repfnz[lVar9 + -1] = iVar1;
          }
        }
      }
      jcol = (int)uVar11;
      iVar7 = local_48[local_68 + 1];
      local_68 = local_68 + 1;
    } while (iVar7 != -1);
  }
  iVar7 = jcol + 1;
  if (jcol == 0) {
    *piVar4 = 0;
    local_8c = 0;
  }
  else {
    iVar13 = piVar3[local_8c];
    iVar10 = piVar5[local_70];
    if ((((local_58 <= jcol - iVar13) || (next == iVar10)) ||
        (next - iVar10 != ~piVar5[iVar15] + iVar10)) || (iVar14 == -1)) {
      iVar14 = next;
      if (iVar13 < iVar15) {
        iVar14 = piVar5[(long)iVar13 + 1];
        piVar5[iVar15] = iVar14;
        piVar5[local_70] = iVar14;
        if (iVar10 < next) {
          lVar9 = 0;
          do {
            piVar12[iVar14 + lVar9] = piVar12[iVar10 + lVar9];
            lVar9 = lVar9 + 1;
          } while ((long)next - (long)iVar10 != lVar9);
          iVar14 = (int)lVar9 + iVar14;
        }
      }
      next = iVar14;
      local_8c = local_8c + 1;
      piVar4[local_70] = local_8c;
    }
  }
  piVar3[(long)local_8c + 1] = iVar7;
  piVar4[iVar7] = local_8c;
  piVar5[iVar7] = next;
  return 0;
}

Assistant:

int
ilu_scolumn_dfs(
	   const int  m,	 /* in - number of rows in the matrix */
	   const int  jcol,	 /* in */
	   int	      *perm_r,	 /* in */
	   int	      *nseg,	 /* modified - with new segments appended */
	   int	      *lsub_col, /* in - defines the RHS vector to start the
				    dfs */
	   int	      *segrep,	 /* modified - with new segments appended */
	   int	      *repfnz,	 /* modified */
	   int	      *marker,	 /* modified */
	   int	      *parent,	 /* working array */
	   int_t      *xplore,	 /* working array */
	   GlobalLU_t *Glu	 /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     k, krep, krow, kmark, kperm;
    int     *marker2;		/* Used for small panel LU */
    int     fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int     chperm, chmark, chrep, kchild, kpar, oldrep;
    int_t   xdfs, maxdfs; 
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom; 	/* Used to compress row subscripts */
    int_t   mem_error, nextl;
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax;
    int     maxsuper;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(7);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];


    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];

	/* krow was visited before, go to the next nonzero */
	if ( kmark == jcol ) continue;

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow;	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		if ((mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu)))
		    return (mem_error);
		lsub = Glu->lsub;
	    }
	    if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
		if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
		parent[krep] = oldrep;
		repfnz[krep] = kperm;
		xdfs = xlsub[xsup[supno[krep]]];
		maxdfs = xlsub[krep + 1];

		do {
		    /*
		     * For each unmarked kchild of krep
		     */
		    while ( xdfs < maxdfs ) {

			kchild = lsub[xdfs];
			xdfs++;
			chmark = marker2[kchild];

			if ( chmark != jcol ) { /* Not reached yet */
			    marker2[kchild] = jcol;
			    chperm = perm_r[kchild];

			    /* Case kchild is in L: place it in L[*,k] */
			    if ( chperm == SLU_EMPTY ) {
				lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    if ( (mem_error = sLUMemXpand(jcol,nextl,
					    LSUB,&nzlmax,Glu)) )
					return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
				/* Case kchild is in U:
				 *   chrep = its supernode-rep. If its rep has
				 *   been explored, update its repfnz[*]
				 */
				chrep = xsup[supno[chperm]+1] - 1;
				myfnz = repfnz[chrep];
				if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
					repfnz[chrep] = chperm;
				} else {
				    /* Continue dfs at super-rep of kchild */
				    xplore[krep] = xdfs;
				    oldrep = krep;
				    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
				    repfnz[krep] = chperm;
				    xdfs = xlsub[xsup[supno[krep]]];
				    maxdfs = xlsub[krep + 1];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
		     *	  place supernode-rep krep in postorder DFS.
		     *	  backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xlsub[krep + 1];

		} while ( kpar != SLU_EMPTY );	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;

	/* Always start a new supernode for a singular column */
	if ( nextl == jptr ) jsuper = SLU_EMPTY;

	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first columns of the supernode.
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1) ) { /* >= 2 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
		ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		xlsub[jcol] = ito;
		for (ifrom = jptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */

    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xlsub[jcolp1]  = nextl;

    return 0;
}